

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_cleanup(CURLM *multi_handle)

{
  SessionHandle *pSVar1;
  _Bool restore_pipe;
  SessionHandle *nextdata;
  SessionHandle *data;
  Curl_multi *multi;
  CURLM *multi_handle_local;
  
  if ((multi_handle == (CURLM *)0x0) || (*multi_handle != 0xbab1e)) {
    multi_handle_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else {
    *(undefined8 *)multi_handle = 0;
    close_all_connections((Curl_multi *)multi_handle);
    if (*(long *)((long)multi_handle + 0x68) != 0) {
      *(undefined8 *)(*(long *)((long)multi_handle + 0x68) + 0x50) =
           *(undefined8 *)((long)multi_handle + 0x40);
      Curl_hostcache_clean
                (*(SessionHandle **)((long)multi_handle + 0x68),
                 *(curl_hash **)(*(long *)((long)multi_handle + 0x68) + 0x50));
      Curl_close(*(SessionHandle **)((long)multi_handle + 0x68));
    }
    Curl_hash_destroy(*(curl_hash **)((long)multi_handle + 0x50));
    Curl_conncache_destroy(*(conncache **)((long)multi_handle + 0x60));
    Curl_llist_destroy(*(curl_llist **)((long)multi_handle + 0x20),(void *)0x0);
    Curl_llist_destroy(*(curl_llist **)((long)multi_handle + 0x28),(void *)0x0);
    nextdata = *(SessionHandle **)((long)multi_handle + 8);
    while (nextdata != (SessionHandle *)0x0) {
      pSVar1 = nextdata->next;
      if ((nextdata->dns).hostcachetype == HCACHE_MULTI) {
        Curl_hostcache_clean(nextdata,(nextdata->dns).hostcache);
        (nextdata->dns).hostcache = (curl_hash *)0x0;
        (nextdata->dns).hostcachetype = HCACHE_NONE;
      }
      (nextdata->state).conn_cache = (conncache *)0x0;
      nextdata->multi = (Curl_multi *)0x0;
      nextdata = pSVar1;
    }
    Curl_hash_destroy(*(curl_hash **)((long)multi_handle + 0x40));
    Curl_pipeline_set_site_blacklist((char **)0x0,(curl_llist **)((long)multi_handle + 0xa0));
    Curl_pipeline_set_server_blacklist((char **)0x0,(curl_llist **)((long)multi_handle + 0xa8));
    (*Curl_cfree)(multi_handle);
    multi_handle_local._4_4_ = CURLM_OK;
  }
  return multi_handle_local._4_4_;
}

Assistant:

CURLMcode curl_multi_cleanup(CURLM *multi_handle)
{
  struct Curl_multi *multi=(struct Curl_multi *)multi_handle;
  struct SessionHandle *data;
  struct SessionHandle *nextdata;

  if(GOOD_MULTI_HANDLE(multi)) {
    bool restore_pipe = FALSE;
    SIGPIPE_VARIABLE(pipe_st);

    multi->type = 0; /* not good anymore */

    /* Close all the connections in the connection cache */
    close_all_connections(multi);

    if(multi->closure_handle) {
      sigpipe_ignore(multi->closure_handle, &pipe_st);
      restore_pipe = TRUE;

      multi->closure_handle->dns.hostcache = multi->hostcache;
      Curl_hostcache_clean(multi->closure_handle,
                           multi->closure_handle->dns.hostcache);

      Curl_close(multi->closure_handle);
    }

    Curl_hash_destroy(multi->sockhash);
    Curl_conncache_destroy(multi->conn_cache);
    Curl_llist_destroy(multi->msglist, NULL);
    Curl_llist_destroy(multi->pending, NULL);

    /* remove all easy handles */
    data = multi->easyp;
    while(data) {
      nextdata=data->next;
      if(data->dns.hostcachetype == HCACHE_MULTI) {
        /* clear out the usage of the shared DNS cache */
        Curl_hostcache_clean(data, data->dns.hostcache);
        data->dns.hostcache = NULL;
        data->dns.hostcachetype = HCACHE_NONE;
      }

      /* Clear the pointer to the connection cache */
      data->state.conn_cache = NULL;
      data->multi = NULL; /* clear the association */

      data = nextdata;
    }

    Curl_hash_destroy(multi->hostcache);

    /* Free the blacklists by setting them to NULL */
    Curl_pipeline_set_site_blacklist(NULL, &multi->pipelining_site_bl);
    Curl_pipeline_set_server_blacklist(NULL, &multi->pipelining_server_bl);

    free(multi);
    if(restore_pipe)
      sigpipe_restore(&pipe_st);

    return CURLM_OK;
  }
  else
    return CURLM_BAD_HANDLE;
}